

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O1

Gia_Man_t * Abc_NtkFunctionalIsoGia(Abc_Ntk_t *pNtk,int iCo1,int iCo2,int fCommon)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  int *piVar5;
  ulong uVar6;
  Gia_Obj_t *pGVar7;
  long *plVar8;
  uint uVar9;
  uint uVar10;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Gia_Man_t *p_01;
  size_t sVar11;
  char *pcVar12;
  Vec_Int_t *p_02;
  int *piVar13;
  Abc_Obj_t *pAVar14;
  Gia_Obj_t *pGVar15;
  Gia_Man_t *pGVar16;
  int iVar17;
  int iVar18;
  int *piVar19;
  long lVar20;
  int *piVar21;
  int iVar22;
  long lVar23;
  int *piVar24;
  int *piVar25;
  
  p = Abc_NtkNodeSupportInt(pNtk,iCo1);
  p_00 = Abc_NtkNodeSupportInt(pNtk,iCo2);
  iVar17 = p->nSize;
  iVar18 = p_00->nSize;
  if (iVar17 != iVar18) {
    pGVar16 = (Gia_Man_t *)0x0;
LAB_0084e993:
    if (p->pArray != (int *)0x0) {
      free(p->pArray);
      p->pArray = (int *)0x0;
    }
    if (p != (Vec_Int_t *)0x0) {
      free(p);
    }
    if (p_00->pArray != (int *)0x0) {
      free(p_00->pArray);
      p_00->pArray = (int *)0x0;
    }
    if (p_00 != (Vec_Int_t *)0x0) {
      free(p_00);
    }
    return pGVar16;
  }
  p_01 = Gia_ManStart(1000);
  pcVar4 = pNtk->pName;
  if (pcVar4 == (char *)0x0) {
    pcVar12 = (char *)0x0;
  }
  else {
    sVar11 = strlen(pcVar4);
    pcVar12 = (char *)malloc(sVar11 + 1);
    strcpy(pcVar12,pcVar4);
  }
  p_01->pName = pcVar12;
  pcVar4 = pNtk->pSpec;
  if (pcVar4 == (char *)0x0) {
    pcVar12 = (char *)0x0;
  }
  else {
    sVar11 = strlen(pcVar4);
    pcVar12 = (char *)malloc(sVar11 + 1);
    strcpy(pcVar12,pcVar4);
  }
  p_01->pSpec = pcVar12;
  Gia_ManHashStart(p_01);
  if (fCommon != 0) {
    p_02 = (Vec_Int_t *)malloc(0x10);
    iVar22 = 0x10;
    if (0xe < iVar17 - 1U) {
      iVar22 = iVar17;
    }
    p_02->nSize = 0;
    p_02->nCap = iVar22;
    if (iVar22 == 0) {
      piVar13 = (int *)0x0;
    }
    else {
      piVar13 = (int *)malloc((long)iVar22 << 2);
    }
    p_02->pArray = piVar13;
    piVar13 = p->pArray;
    piVar5 = p_00->pArray;
    p_02->nSize = 0;
    piVar19 = piVar13;
    piVar21 = piVar5;
    piVar24 = piVar5;
    piVar25 = piVar13;
    if ((0 < iVar17) && (0 < iVar18)) {
      do {
        iVar22 = *piVar25;
        iVar1 = *piVar21;
        if (iVar22 == iVar1) {
          Vec_IntPush(p_02,iVar22);
          piVar25 = piVar25 + 1;
          piVar21 = piVar21 + 1;
        }
        else if (iVar22 < iVar1) {
          piVar25 = piVar25 + 1;
          *piVar19 = iVar22;
          piVar19 = piVar19 + 1;
        }
        else {
          piVar21 = piVar21 + 1;
          *piVar24 = iVar1;
          piVar24 = piVar24 + 1;
        }
      } while ((piVar25 < piVar13 + iVar17) && (piVar21 < piVar5 + iVar18));
    }
    for (; piVar25 < piVar13 + iVar17; piVar25 = piVar25 + 1) {
      *piVar19 = *piVar25;
      piVar19 = piVar19 + 1;
    }
    for (; piVar21 < piVar5 + iVar18; piVar21 = piVar21 + 1) {
      *piVar24 = *piVar21;
      piVar24 = piVar24 + 1;
    }
    iVar17 = (int)((ulong)((long)piVar19 - (long)piVar13) >> 2);
    if (p->nSize < iVar17) {
LAB_0084eac4:
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
    }
    p->nSize = iVar17;
    iVar17 = (int)((ulong)((long)piVar24 - (long)piVar5) >> 2);
    if (p_00->nSize < iVar17) goto LAB_0084eac4;
    p_00->nSize = iVar17;
    iVar17 = p_02->nSize;
    lVar20 = (long)iVar17;
    if (0 < lVar20) {
      piVar13 = p_02->pArray;
      lVar23 = 0;
      do {
        Vec_IntPush(p,piVar13[lVar23]);
        lVar23 = lVar23 + 1;
      } while (lVar20 != lVar23);
      if (0 < iVar17) {
        piVar13 = p_02->pArray;
        lVar23 = 0;
        do {
          Vec_IntPush(p_00,piVar13[lVar23]);
          lVar23 = lVar23 + 1;
        } while (lVar20 != lVar23);
      }
    }
    if (p_02->pArray != (int *)0x0) {
      free(p_02->pArray);
      p_02->pArray = (int *)0x0;
    }
    free(p_02);
    if (p->nSize != p_00->nSize) {
      __assert_fail("Vec_IntSize(vSupp1) == Vec_IntSize(vSupp2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                    ,0x3ec,"Gia_Man_t *Abc_NtkFunctionalIsoGia(Abc_Ntk_t *, int, int, int)");
    }
  }
  pAVar14 = Abc_AigConst1(pNtk);
  (pAVar14->field_6).iTemp = 1;
  iVar17 = p->nSize;
  if (0 < (long)iVar17) {
    piVar13 = p->pArray;
    lVar20 = 0;
    do {
      uVar9 = piVar13[lVar20];
      pGVar15 = Gia_ManAppendObj(p_01);
      uVar6 = *(ulong *)pGVar15;
      *(ulong *)pGVar15 = uVar6 | 0x9fffffff;
      *(ulong *)pGVar15 =
           uVar6 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar7 = p_01->pObjs;
      if ((pGVar15 < pGVar7) || (pGVar7 + p_01->nObjs <= pGVar15)) goto LAB_0084e9eb;
      Vec_IntPush(p_01->vCis,(int)((ulong)((long)pGVar15 - (long)pGVar7) >> 2) * -0x55555555);
      pGVar7 = p_01->pObjs;
      if ((pGVar15 < pGVar7) || (pGVar7 + p_01->nObjs <= pGVar15)) goto LAB_0084e9eb;
      if (((int)uVar9 < 0) || (pNtk->vCis->nSize <= (int)uVar9)) goto LAB_0084ea0a;
      *(int *)((long)pNtk->vCis->pArray[uVar9] + 0x40) =
           (int)((ulong)((long)pGVar15 - (long)pGVar7) >> 2) * 0x55555556;
      lVar20 = lVar20 + 1;
    } while (iVar17 != lVar20);
  }
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar17 = pNtk->vObjs->nSize;
    uVar6 = (long)iVar17 + 500;
    iVar18 = (int)uVar6;
    if ((pNtk->vTravIds).nCap < iVar18) {
      piVar13 = (int *)malloc(uVar6 * 4);
      (pNtk->vTravIds).pArray = piVar13;
      if (piVar13 == (int *)0x0) goto LAB_0084eb02;
      (pNtk->vTravIds).nCap = iVar18;
    }
    if (-500 < iVar17) {
      memset((pNtk->vTravIds).pArray,0,(uVar6 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar18;
  }
  iVar17 = pNtk->nTravIds;
  pNtk->nTravIds = iVar17 + 1;
  if (0x3ffffffe < iVar17) {
LAB_0084ea86:
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  if ((iCo1 < 0) || (pNtk->vCos->nSize <= iCo1)) {
LAB_0084ea0a:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  plVar8 = (long *)pNtk->vCos->pArray[(uint)iCo1];
  uVar9 = Abc_NtkFunctionalIsoGia_rec
                    (p_01,*(Abc_Obj_t **)
                           (*(long *)(*(long *)(*plVar8 + 0x20) + 8) + (long)*(int *)plVar8[4] * 8))
  ;
  if (-1 < (int)uVar9) {
    uVar2 = *(uint *)((long)plVar8 + 0x14);
    iVar17 = p_00->nSize;
    if (0 < (long)iVar17) {
      piVar13 = p_00->pArray;
      lVar20 = 0;
      do {
        if (p_01->vCis->nSize <= lVar20) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar18 = p_01->vCis->pArray[lVar20];
        if (((long)iVar18 < 0) || (p_01->nObjs <= iVar18)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar7 = p_01->pObjs;
        pGVar15 = (Gia_Obj_t *)((ulong)(pGVar7 + iVar18) & 0xfffffffffffffffe);
        if ((pGVar15 < pGVar7) || (pGVar7 + p_01->nObjs <= pGVar15)) {
LAB_0084e9eb:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar22 = (int)((ulong)((long)pGVar15 - (long)pGVar7) >> 2);
        if (iVar22 * -0x55555555 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        uVar10 = piVar13[lVar20];
        if (((int)uVar10 < 0) || (pNtk->vCis->nSize <= (int)uVar10)) goto LAB_0084ea0a;
        *(uint *)((long)pNtk->vCis->pArray[uVar10] + 0x40) =
             ((uint)(pGVar7 + iVar18) & 1) + iVar22 * 0x55555556;
        lVar20 = lVar20 + 1;
      } while (iVar17 != lVar20);
    }
    if ((pNtk->vTravIds).pArray == (int *)0x0) {
      iVar17 = pNtk->vObjs->nSize;
      uVar6 = (long)iVar17 + 500;
      iVar18 = (int)uVar6;
      if ((pNtk->vTravIds).nCap < iVar18) {
        piVar13 = (int *)malloc(uVar6 * 4);
        (pNtk->vTravIds).pArray = piVar13;
        if (piVar13 == (int *)0x0) {
LAB_0084eb02:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (pNtk->vTravIds).nCap = iVar18;
      }
      if (-500 < iVar17) {
        memset((pNtk->vTravIds).pArray,0,(uVar6 & 0xffffffff) << 2);
      }
      (pNtk->vTravIds).nSize = iVar18;
    }
    iVar17 = pNtk->nTravIds;
    pNtk->nTravIds = iVar17 + 1;
    if (0x3ffffffe < iVar17) goto LAB_0084ea86;
    if ((iCo2 < 0) || (pNtk->vCos->nSize <= iCo2)) goto LAB_0084ea0a;
    plVar8 = (long *)pNtk->vCos->pArray[(uint)iCo2];
    uVar10 = Abc_NtkFunctionalIsoGia_rec
                       (p_01,*(Abc_Obj_t **)
                              (*(long *)(*(long *)(*plVar8 + 0x20) + 8) +
                              (long)*(int *)plVar8[4] * 8));
    if (-1 < (int)uVar10) {
      uVar3 = *(uint *)((long)plVar8 + 0x14);
      Gia_ManAppendCo(p_01,uVar2 >> 10 & 1 ^ uVar9);
      Gia_ManAppendCo(p_01,uVar3 >> 10 & 1 ^ uVar10);
      pGVar16 = Gia_ManCleanup(p_01);
      Gia_ManStop(p_01);
      goto LAB_0084e993;
    }
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                ,0x132,"int Abc_LitNotCond(int, int)");
}

Assistant:

Gia_Man_t * Abc_NtkFunctionalIsoGia( Abc_Ntk_t * pNtk, int iCo1, int iCo2, int fCommon )
{
    Gia_Man_t * pNew = NULL, * pTemp;
    Vec_Int_t * vSupp1 = Abc_NtkNodeSupportInt( pNtk, iCo1 );
    Vec_Int_t * vSupp2 = Abc_NtkNodeSupportInt( pNtk, iCo2 );
    if ( Vec_IntSize(vSupp1) == Vec_IntSize(vSupp2) )
    {
        Abc_Obj_t * pObj;
        int i, iCi, iLit1, iLit2;
        pNew = Gia_ManStart( 1000 );
        pNew->pName = Abc_UtilStrsav( pNtk->pName );
        pNew->pSpec = Abc_UtilStrsav( pNtk->pSpec );
        Gia_ManHashStart( pNew );
        // put commom together
        if ( fCommon )
        {
            Vec_Int_t * vCommon = Vec_IntAlloc( Vec_IntSize(vSupp1) );
            Vec_IntTwoRemoveCommon( vSupp1, vSupp2, vCommon );
            Vec_IntAppend( vSupp1, vCommon );
            Vec_IntAppend( vSupp2, vCommon );
            Vec_IntFree( vCommon );
            assert( Vec_IntSize(vSupp1) == Vec_IntSize(vSupp2) );            
        }
        // primary inputs
        Abc_AigConst1(pNtk)->iTemp = 1;
        Vec_IntForEachEntry( vSupp1, iCi, i )
            Abc_NtkCi(pNtk, iCi)->iTemp = Gia_ManAppendCi(pNew);
        // create the first cone
        Abc_NtkIncrementTravId( pNtk );
        pObj = Abc_NtkCo( pNtk, iCo1 );
        iLit1 = Abc_NtkFunctionalIsoGia_rec( pNew, Abc_ObjFanin0(pObj) );
        iLit1 = Abc_LitNotCond( iLit1, Abc_ObjFaninC0(pObj) );
        // primary inputs
        Vec_IntForEachEntry( vSupp2, iCi, i )
            Abc_NtkCi(pNtk, iCi)->iTemp = Gia_ManCiLit(pNew, i);
        // create the second cone
        Abc_NtkIncrementTravId( pNtk );
        pObj = Abc_NtkCo( pNtk, iCo2 );
        iLit2 = Abc_NtkFunctionalIsoGia_rec( pNew, Abc_ObjFanin0(pObj) );
        iLit2 = Abc_LitNotCond( iLit2, Abc_ObjFaninC0(pObj) );
        Gia_ManAppendCo( pNew, iLit1 );
        Gia_ManAppendCo( pNew, iLit2 );
        // perform cleanup
        pNew = Gia_ManCleanup( pTemp = pNew );
        Gia_ManStop( pTemp );
    }
    Vec_IntFree( vSupp1 );
    Vec_IntFree( vSupp2 );
    return pNew;
}